

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O0

LY_ERR json_print_metadata(jsonpr_ctx *pctx,lyd_node *node,lys_module *wdmod)

{
  ly_bool lVar1;
  LY_ERR LVar2;
  char *pcVar3;
  ly_ctx *local_68;
  uint local_54;
  uint local_44;
  lyd_meta *plStack_30;
  LY_ERR ret__;
  lyd_meta *meta;
  lys_module *wdmod_local;
  lyd_node *node_local;
  jsonpr_ctx *pctx_local;
  
  if (wdmod != (lys_module *)0x0) {
    if ((pctx->options & 2) == 0) {
      local_44 = (uint)pctx->level << 1;
    }
    else {
      local_44 = 0;
    }
    pcVar3 = "\t";
    if ((pctx->options & 2) == 0) {
      pcVar3 = ", ";
    }
    ly_print_(pctx->out,"%*s\"%s:default\":%strue",(ulong)local_44,"",wdmod->name,pcVar3 + 1);
    pctx->level_printed = pctx->level;
  }
  plStack_30 = node->meta;
  do {
    if (plStack_30 == (lyd_meta *)0x0) {
      return LY_SUCCESS;
    }
    lVar1 = lyd_metadata_should_print(plStack_30);
    if (lVar1 != '\0') {
      if (pctx->level <= pctx->level_printed) {
        pcVar3 = "";
        if ((pctx->options & 2) == 0) {
          pcVar3 = "\n";
        }
        ly_print_(pctx->out,",%s",pcVar3);
      }
      if ((pctx->options & 2) == 0) {
        local_54 = (uint)pctx->level << 1;
      }
      else {
        local_54 = 0;
      }
      pcVar3 = "\t";
      if ((pctx->options & 2) == 0) {
        pcVar3 = ", ";
      }
      ly_print_(pctx->out,"%*s\"%s:%s\":%s",(ulong)local_54,"",plStack_30->annotation->module->name,
                plStack_30->name,pcVar3 + 1);
      if (node->schema == (lysc_node *)0x0) {
        local_68 = (ly_ctx *)node[2].schema;
      }
      else {
        local_68 = node->schema->module->ctx;
      }
      LVar2 = json_print_value(pctx,local_68,&plStack_30->value,(lys_module *)0x0);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      pctx->level_printed = pctx->level;
    }
    plStack_30 = plStack_30->next;
  } while( true );
}

Assistant:

static LY_ERR
json_print_metadata(struct jsonpr_ctx *pctx, const struct lyd_node *node, const struct lys_module *wdmod)
{
    struct lyd_meta *meta;

    if (wdmod) {
        ly_print_(pctx->out, "%*s\"%s:default\":%strue", INDENT, wdmod->name, DO_FORMAT ? " " : "");
        LEVEL_PRINTED;
    }

    for (meta = node->meta; meta; meta = meta->next) {
        if (!lyd_metadata_should_print(meta)) {
            continue;
        }
        PRINT_COMMA;
        ly_print_(pctx->out, "%*s\"%s:%s\":%s", INDENT, meta->annotation->module->name, meta->name, DO_FORMAT ? " " : "");
        LY_CHECK_RET(json_print_value(pctx, LYD_CTX(node), &meta->value, NULL));
        LEVEL_PRINTED;
    }

    return LY_SUCCESS;
}